

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O1

FT_Error tt_face_get_name(TT_Face face,FT_UShort nameid,FT_String **name)

{
  FT_Memory memory;
  TT_NameRec *pTVar1;
  FT_Stream stream;
  byte bVar2;
  FT_Error FVar3;
  FT_Error extraout_EAX;
  ulong in_RAX;
  FT_String *pFVar4;
  FT_Byte *pFVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  code *pcVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  TT_NameRec *pTVar14;
  FT_Error error;
  undefined8 local_38;
  
  memory = (face->root).memory;
  local_38 = in_RAX & 0xffffffff00000000;
  pTVar1 = (face->name_table).names;
  uVar6 = 0;
  pTVar14 = pTVar1;
  if (face->num_names == 0) {
    uVar10 = 0xffffffff;
    uVar13 = 0xffffffff;
    uVar11 = 0xffffffff;
    uVar8 = 0xffffffff;
  }
  else {
    uVar8 = 0xffffffff;
    local_38 = 0;
    uVar11 = 0xffffffff;
    uVar10 = 0xffffffff;
    uVar12 = 0xffffffff;
    do {
      uVar13 = uVar12;
      if ((pTVar14->nameID == nameid) && (pTVar14->stringLength != 0)) {
        switch(pTVar14->platformID) {
        case 0:
        case 2:
          uVar8 = uVar6;
          break;
        case 1:
          uVar13 = uVar6;
          if ((pTVar14->languageID != 0) && (uVar13 = uVar12, pTVar14->encodingID == 0)) {
            uVar10 = uVar6;
          }
          break;
        case 3:
          if ((((uVar11 == 0xffffffff) || ((pTVar14->languageID & 0x3ff) == 9)) &&
              (pTVar14->encodingID < 0xb)) && ((0x403U >> (pTVar14->encodingID & 0x1f) & 1) != 0)) {
            uVar11 = pTVar14->languageID & 0x3ff;
            local_38 = (ulong)CONCAT31((int3)(uVar11 >> 8),(short)uVar11 == 9) << 0x20;
            uVar11 = uVar6;
          }
        }
      }
      uVar6 = uVar6 + 1;
      pTVar14 = pTVar14 + 1;
      uVar12 = uVar13;
    } while (face->num_names != uVar6);
    uVar6 = (uint)(local_38._4_1_ != '\0');
  }
  if (-1 < (int)uVar13) {
    uVar10 = uVar13;
  }
  if (((int)uVar11 < 0) || (-1 < (int)uVar10 && uVar6 == 0)) {
    if ((int)uVar10 < 0) {
      if ((int)uVar8 < 0) goto LAB_0024d046;
      pcVar9 = tt_name_ascii_from_utf16;
    }
    else {
      pcVar9 = tt_name_ascii_from_other;
      uVar8 = uVar10;
    }
    pTVar14 = pTVar1 + uVar8;
    bVar2 = 1;
  }
  else {
    pTVar14 = pTVar1 + uVar11;
    if ((pTVar1[uVar11].encodingID < 2) || (pTVar1[uVar11].encodingID == 10)) {
      pcVar9 = tt_name_ascii_from_utf16;
      bVar2 = 1;
    }
    else {
LAB_0024d046:
      bVar2 = 0;
      pcVar9 = (code *)0x0;
    }
  }
  if ((bool)(bVar2 ^ 1) || pTVar14 == (TT_NameRec *)0x0) {
LAB_0024d0f8:
    pFVar4 = (FT_String *)0x0;
  }
  else {
    if (pTVar14->string == (FT_Byte *)0x0) {
      stream = (face->name_table).stream;
      pFVar5 = (FT_Byte *)
               ft_mem_qrealloc(memory,1,0,(ulong)pTVar14->stringLength,(void *)0x0,
                               (FT_Error *)&local_38);
      pTVar14->string = pFVar5;
      if ((int)local_38 == 0) {
        FVar3 = FT_Stream_Seek(stream,pTVar14->stringOffset);
        local_38 = CONCAT44(local_38._4_4_,FVar3);
        if (FVar3 != 0) goto LAB_0024d0c9;
        FVar3 = FT_Stream_Read(stream,pTVar14->string,(ulong)pTVar14->stringLength);
        local_38 = CONCAT44(local_38._4_4_,FVar3);
        if (FVar3 != 0) goto LAB_0024d0c9;
        iVar7 = 0;
        FVar3 = 0;
      }
      else {
LAB_0024d0c9:
        ft_mem_free(memory,pTVar14->string);
        pTVar14->string = (FT_Byte *)0x0;
        pTVar14->stringLength = 0;
        iVar7 = 0xc;
        FVar3 = extraout_EAX;
      }
      if (iVar7 == 0xc) goto LAB_0024d0f8;
      if (iVar7 != 0) {
        return FVar3;
      }
    }
    pFVar4 = (FT_String *)(*pcVar9)(pTVar14,memory);
  }
  *name = pFVar4;
  return (int)local_38;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_get_name( TT_Face      face,
                    FT_UShort    nameid,
                    FT_String**  name )
  {
    FT_Memory   memory = face->root.memory;
    FT_Error    error  = FT_Err_Ok;
    FT_String*  result = NULL;
    FT_UShort   n;
    TT_Name     rec;

    FT_Int  found_apple         = -1;
    FT_Int  found_apple_roman   = -1;
    FT_Int  found_apple_english = -1;
    FT_Int  found_win           = -1;
    FT_Int  found_unicode       = -1;

    FT_Bool  is_english = 0;

    TT_Name_ConvertFunc  convert;


    FT_ASSERT( name );

    rec = face->name_table.names;
    for ( n = 0; n < face->num_names; n++, rec++ )
    {
      /* According to the OpenType 1.3 specification, only Microsoft or  */
      /* Apple platform IDs might be used in the `name' table.  The      */
      /* `Unicode' platform is reserved for the `cmap' table, and the    */
      /* `ISO' one is deprecated.                                        */
      /*                                                                 */
      /* However, the Apple TrueType specification doesn't say the same  */
      /* thing and goes to suggest that all Unicode `name' table entries */
      /* should be coded in UTF-16 (in big-endian format I suppose).     */
      /*                                                                 */
      if ( rec->nameID == nameid && rec->stringLength > 0 )
      {
        switch ( rec->platformID )
        {
        case TT_PLATFORM_APPLE_UNICODE:
        case TT_PLATFORM_ISO:
          /* there is `languageID' to check there.  We should use this */
          /* field only as a last solution when nothing else is        */
          /* available.                                                */
          /*                                                           */
          found_unicode = n;
          break;

        case TT_PLATFORM_MACINTOSH:
          /* This is a bit special because some fonts will use either    */
          /* an English language id, or a Roman encoding id, to indicate */
          /* the English version of its font name.                       */
          /*                                                             */
          if ( rec->languageID == TT_MAC_LANGID_ENGLISH )
            found_apple_english = n;
          else if ( rec->encodingID == TT_MAC_ID_ROMAN )
            found_apple_roman = n;
          break;

        case TT_PLATFORM_MICROSOFT:
          /* we only take a non-English name when there is nothing */
          /* else available in the font                            */
          /*                                                       */
          if ( found_win == -1 || ( rec->languageID & 0x3FF ) == 0x009 )
          {
            switch ( rec->encodingID )
            {
            case TT_MS_ID_SYMBOL_CS:
            case TT_MS_ID_UNICODE_CS:
            case TT_MS_ID_UCS_4:
              is_english = FT_BOOL( ( rec->languageID & 0x3FF ) == 0x009 );
              found_win  = n;
              break;

            default:
              ;
            }
          }
          break;

        default:
          ;
        }
      }
    }

    found_apple = found_apple_roman;
    if ( found_apple_english >= 0 )
      found_apple = found_apple_english;

    /* some fonts contain invalid Unicode or Macintosh formatted entries; */
    /* we will thus favor names encoded in Windows formats if available   */
    /* (provided it is an English name)                                   */
    /*                                                                    */
    convert = NULL;
    if ( found_win >= 0 && !( found_apple >= 0 && !is_english ) )
    {
      rec = face->name_table.names + found_win;
      switch ( rec->encodingID )
      {
        /* all Unicode strings are encoded using UTF-16BE */
      case TT_MS_ID_UNICODE_CS:
      case TT_MS_ID_SYMBOL_CS:
        convert = tt_name_ascii_from_utf16;
        break;

      case TT_MS_ID_UCS_4:
        /* Apparently, if this value is found in a name table entry, it is */
        /* documented as `full Unicode repertoire'.  Experience with the   */
        /* MsGothic font shipped with Windows Vista shows that this really */
        /* means UTF-16 encoded names (UCS-4 values are only used within   */
        /* charmaps).                                                      */
        convert = tt_name_ascii_from_utf16;
        break;

      default:
        ;
      }
    }
    else if ( found_apple >= 0 )
    {
      rec     = face->name_table.names + found_apple;
      convert = tt_name_ascii_from_other;
    }
    else if ( found_unicode >= 0 )
    {
      rec     = face->name_table.names + found_unicode;
      convert = tt_name_ascii_from_utf16;
    }

    if ( rec && convert )
    {
      if ( !rec->string )
      {
        FT_Stream  stream = face->name_table.stream;


        if ( FT_QNEW_ARRAY ( rec->string, rec->stringLength ) ||
             FT_STREAM_SEEK( rec->stringOffset )              ||
             FT_STREAM_READ( rec->string, rec->stringLength ) )
        {
          FT_FREE( rec->string );
          rec->stringLength = 0;
          result            = NULL;
          goto Exit;
        }
      }

      result = convert( rec, memory );
    }

  Exit:
    *name = result;
    return error;
  }